

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

bool __thiscall duckdb::AsOfLocalSourceState::MergeLeftPartitions(AsOfLocalSourceState *this)

{
  atomic<unsigned_long> *paVar1;
  __int_type_conflict _Var2;
  type gstate;
  PartitionGlobalMergeStates *this_00;
  Callback local_callback;
  PartitionLocalMergeState local_merge;
  Callback local_f0;
  PartitionLocalMergeState local_e8;
  
  local_f0._vptr_Callback = (_func_int **)&PTR__Callback_024a6460;
  gstate = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
           ::operator*(&this->gsource->gsink->lhs_sink);
  PartitionLocalMergeState::PartitionLocalMergeState(&local_e8,gstate);
  this_00 = AsOfGlobalSourceState::GetMergeStates(this->gsource);
  PartitionGlobalMergeStates::ExecuteTask(this_00,&local_e8,&local_f0);
  LOCK();
  paVar1 = &this->gsource->merged;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  while (((this->gsource->merged).super___atomic_base<unsigned_long>._M_i <
          (this->gsource->mergers).super___atomic_base<unsigned_long>._M_i &&
         (((this->client->interrupted)._M_base._M_i & 1U) == 0))) {
    TaskScheduler::GetScheduler(this->client);
    TaskScheduler::YieldThread();
  }
  _Var2 = (this->client->interrupted)._M_base._M_i;
  DataChunk::~DataChunk(&local_e8.payload_chunk);
  DataChunk::~DataChunk(&local_e8.sort_chunk);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&local_e8.executor.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  if (local_e8.executor.expressions.
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.executor.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(~_Var2 & 1);
}

Assistant:

bool AsOfLocalSourceState::MergeLeftPartitions() {
	PartitionGlobalMergeStates::Callback local_callback;
	PartitionLocalMergeState local_merge(*gsource.gsink.lhs_sink);
	gsource.GetMergeStates().ExecuteTask(local_merge, local_callback);
	gsource.merged++;
	while (gsource.merged < gsource.mergers && !client.interrupted) {
		TaskScheduler::GetScheduler(client).YieldThread();
	}
	return !client.interrupted;
}